

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

void __thiscall
EDLines::SplitSegment2Lines(EDLines *this,double *x,double *y,int noPixels,int segmentNo)

{
  pointer *ppLVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  LineSegment *pLVar15;
  iterator __position;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  byte bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  int lastInvert;
  double lastB;
  int startIndex;
  double error;
  double lastA;
  double local_118;
  int local_104;
  double local_100;
  ulong local_f8;
  ulong local_f0;
  double *local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  ulong local_c8;
  double local_c0;
  double local_b8;
  int local_ac;
  double *local_a8;
  ulong local_a0;
  double *local_98;
  vector<LineSegment,_std::allocator<LineSegment>_> *local_90;
  double *local_88;
  double *local_80;
  LineSegment local_78;
  
  bVar20 = 0;
  uVar16 = (ulong)(uint)noPixels;
  local_90 = &this->lines;
  iVar7 = 0;
  local_ac = segmentNo;
  do {
    iVar9 = (int)uVar16;
    if (iVar9 < this->min_line_len) {
      return;
    }
    iVar13 = this->min_line_len;
    bVar3 = iVar9 < iVar13;
    if (iVar13 <= iVar9) {
      LineFit(x,y,iVar13,&local_b8,&local_d0,&local_c0,&local_104);
      if (0.5 < local_c0) {
        iVar13 = 0;
        do {
          x = x + 1;
          y = y + 1;
          iVar19 = this->min_line_len;
          bVar3 = iVar9 + iVar13 <= iVar19;
          if (iVar9 + iVar13 <= iVar19) {
            iVar7 = (iVar7 - iVar13) + 1;
            uVar12 = (iVar9 + iVar13) - 1;
            goto LAB_001187ef;
          }
          LineFit(x,y,iVar19,&local_b8,&local_d0,&local_c0,&local_104);
          iVar13 = iVar13 + -1;
        } while (0.5 < local_c0);
        iVar7 = iVar7 - iVar13;
        uVar16 = (ulong)(uint)(iVar9 + iVar13);
      }
      iVar9 = local_104;
      local_f8 = (ulong)(uint)this->min_line_len;
      local_80 = x + 1;
      local_88 = y + 1;
      local_e8 = x;
      local_c8 = local_f8;
      local_a8 = y;
      local_a0 = uVar16;
      do {
        iVar13 = (int)uVar16;
        if (iVar13 <= (int)local_c8) break;
        local_f0 = (ulong)((int)local_c8 - 1);
        local_d8 = local_b8;
        iVar14 = 0;
        local_e0 = local_d0;
        uVar10 = local_c8 & 0xffffffff;
        iVar19 = 0;
        do {
          iVar17 = (int)uVar10;
          if (iVar13 <= iVar17) break;
          dVar21 = ComputeMinDistance(local_e8[iVar17],y[iVar17],local_d8,local_e0,iVar9);
          if (dVar21 <= this->line_error) {
            iVar14 = iVar14 + 1;
            iVar8 = 0;
            local_f0 = uVar10;
LAB_001183e3:
            uVar10 = (ulong)(iVar17 + 1);
            bVar4 = true;
            iVar19 = iVar8;
          }
          else {
            iVar8 = iVar19 + 1;
            if (iVar19 < 4) goto LAB_001183e3;
            bVar4 = false;
            iVar19 = iVar8;
          }
        } while (bVar4);
        pdVar5 = local_e8;
        if (1 < iVar14) {
          iVar19 = (int)local_f0;
          uVar12 = ((int)local_f8 - (int)local_c8) + iVar19 + 1;
          local_f8 = (ulong)uVar12;
          LineFit(local_e8,y,uVar12,&local_b8,&local_d0,iVar9);
          uVar10 = (ulong)(iVar19 + 1);
        }
        bVar4 = (int)uVar10 < iVar13;
        local_c8 = uVar10;
        if (!bVar4 || 1 >= iVar14) {
          local_d8 = local_b8;
          local_e0 = local_d0;
          lVar18 = 0;
          do {
            lVar11 = lVar18;
            dVar21 = ComputeMinDistance(pdVar5[lVar11],y[lVar11],local_d8,local_e0,iVar9);
            pdVar6 = local_88;
            lVar18 = lVar11 + 1;
          } while (this->line_error <= dVar21 && dVar21 != this->line_error);
          local_100 = pdVar5[lVar11];
          local_118 = y[lVar11];
          if (iVar9 == 0) {
            if ((local_e0 != 0.0) || (NAN(local_e0))) {
              local_100 = (local_d8 - (local_118 - local_100 * (-1.0 / local_e0))) /
                          (-1.0 / local_e0 - local_e0);
              local_118 = local_e0 * local_100 + local_d8;
            }
            else {
              local_118 = local_d8;
            }
          }
          else if ((local_e0 != 0.0) || (NAN(local_e0))) {
            local_118 = (local_d8 - (local_100 - local_118 * (-1.0 / local_e0))) /
                        (-1.0 / local_e0 - local_e0);
            local_100 = local_e0 * local_118 + local_d8;
          }
          else {
            local_100 = local_d8;
          }
          iVar13 = (int)local_f0;
          local_98 = local_80 + iVar13;
          iVar19 = (iVar13 - (int)lVar11) + 2;
          lVar18 = 0;
          do {
            dVar21 = ComputeMinDistance(local_98[lVar18 + -1],pdVar6[(long)iVar13 + lVar18 + -1],
                                        local_d8,local_e0,iVar9);
            uVar16 = local_a0;
            y = local_a8;
            lVar18 = lVar18 + -1;
            iVar19 = iVar19 + -1;
          } while (this->line_error <= dVar21 && dVar21 != this->line_error);
          dVar21 = local_98[lVar18];
          dVar2 = pdVar6[iVar13 + lVar18];
          if (iVar9 == 0) {
            if ((local_e0 != 0.0) || (dVar22 = local_d8, dVar23 = dVar21, NAN(local_e0))) {
              dVar23 = (local_d8 - (dVar2 - dVar21 * (-1.0 / local_e0))) /
                       (-1.0 / local_e0 - local_e0);
              dVar22 = local_e0 * dVar23 + local_d8;
            }
          }
          else if ((local_e0 != 0.0) || (dVar22 = dVar2, dVar23 = local_d8, NAN(local_e0))) {
            dVar22 = (local_d8 - (dVar21 - dVar2 * (-1.0 / local_e0))) /
                     (-1.0 / local_e0 - local_e0);
            dVar23 = local_e0 * dVar22 + local_d8;
          }
          if ((local_118 == dVar22) && (!NAN(local_118) && !NAN(dVar22))) {
            if ((local_100 == dVar23) && (!NAN(local_100) && !NAN(dVar23))) goto LAB_001187ab;
          }
          local_78.a = local_d8;
          local_78.b = local_e0;
          local_78.invert = iVar9;
          local_78.sx = local_100;
          local_78.sy = local_118;
          local_78.ex = dVar23;
          local_78.ey = dVar22;
          local_78.segmentNo = local_ac;
          local_78.firstPixelIndex = (int)lVar11 + iVar7;
          local_78.len = iVar19;
          __position._M_current =
               (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<LineSegment,_std::allocator<LineSegment>_>::_M_realloc_insert<LineSegment>
                      (local_90,__position,&local_78);
          }
          else {
            pLVar15 = &local_78;
            for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
              (__position._M_current)->a = pLVar15->a;
              pLVar15 = (LineSegment *)((long)pLVar15 + ((ulong)bVar20 * -2 + 1) * 8);
              __position._M_current = __position._M_current + (ulong)bVar20 * -0x10 + 8;
            }
            ppLVar1 = &(this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppLVar1 = *ppLVar1 + 1;
          }
          this->linesNo = this->linesNo + 1;
          local_f8 = (ulong)((int)local_f0 + (int)lVar18 + 2);
        }
LAB_001187ab:
        iVar13 = (int)uVar16;
      } while (bVar4 && 1 < iVar14);
      iVar9 = (int)local_f8;
      uVar12 = iVar13 - iVar9;
      x = local_e8 + iVar9;
      y = y + iVar9;
      iVar7 = iVar9 + iVar7;
LAB_001187ef:
      uVar16 = (ulong)uVar12;
    }
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void EDLines::SplitSegment2Lines(double * x, double * y, int noPixels, int segmentNo)
{

	// First pixel of the line segment within the segment of points
	int firstPixelIndex = 0;

	while (noPixels >= min_line_len) {
		// Start by fitting a line to MIN_LINE_LEN pixels
		bool valid = false;
		double lastA, lastB, error;
		int lastInvert;

		while (noPixels >= min_line_len) {
			LineFit(x, y, min_line_len, lastA, lastB, error, lastInvert);
			if (error <= 0.5) { valid = true; break; }

#if 1
			noPixels -= 1;   // Go slowly
			x += 1; y += 1;
			firstPixelIndex += 1;
#else
			noPixels -= 2;   // Go faster (for speed)
			x += 2; y += 2;
			firstPixelIndex += 2;
#endif
		} //end-while

		if (valid == false) return;

		// Now try to extend this line
		int index = min_line_len;
		int len = min_line_len;

		while (index < noPixels) {
			int startIndex = index;
			int lastGoodIndex = index - 1;
			int goodPixelCount = 0;
			int badPixelCount = 0;
			while (index < noPixels) {
				double d = ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert);

				if (d <= line_error) {
					lastGoodIndex = index;
					goodPixelCount++;
					badPixelCount = 0;

				}
				else {
					badPixelCount++;
					if (badPixelCount >= 5) break;
				} //end-if

				index++;
			} //end-while

			if (goodPixelCount >= 2) {
				len += lastGoodIndex - startIndex + 1;
				LineFit(x, y, len, lastA, lastB, lastInvert);  // faster LineFit
				index = lastGoodIndex + 1;
			} // end-if

			if (goodPixelCount < 2 || index >= noPixels) {
				// End of a line segment. Compute the end points
				double sx, sy, ex, ey;

				int index = 0;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index++;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, sx, sy);
				int noSkippedPixels = index;

				index = lastGoodIndex;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index--;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, ex, ey);

				if ((sx == ex) & (sy == ey))
					break;

				// Add the line segment to lines
				lines.push_back(LineSegment(lastA, lastB, lastInvert, sx, sy, ex, ey, segmentNo, firstPixelIndex + noSkippedPixels, index - noSkippedPixels + 1));
				linesNo++;
				len = index + 1;
				break;
			} //end-else
		} //end-while

		noPixels -= len;
		x += len;
		y += len;
		firstPixelIndex += len;
	} //end-while
}